

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  int iVar1;
  uint uVar2;
  LogMessage *other;
  bool bVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x139);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->failed_ == false) {
    iVar1 = this->backup_bytes_;
    if (iVar1 < count) {
      this->backup_bytes_ = 0;
      uVar2 = (*this->copying_stream_->_vptr_CopyingInputStream[3])
                        (this->copying_stream_,(ulong)(uint)(count - iVar1));
      this->position_ = this->position_ + (long)(int)uVar2;
      bVar3 = uVar2 == count - iVar1;
    }
    else {
      this->backup_bytes_ = iVar1 - count;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}